

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O1

void __thiscall QMYSQLDriver::QMYSQLDriver(QMYSQLDriver *this,QObject *parent)

{
  QSqlDriverPrivate *this_00;
  
  this_00 = (QSqlDriverPrivate *)operator_new(0xd0);
  QSqlDriverPrivate::QSqlDriverPrivate(this_00,MySqlServer);
  *(undefined ***)this_00 = &PTR__QMYSQLDriverPrivate_001185f0;
  *(undefined8 *)(this_00 + 1) = 0;
  *(undefined8 *)&this_00[1].field_0x8 = 0;
  *(undefined8 *)&this_00[1].field_0x10 = 0;
  *(undefined8 *)&this_00[1].field_0x18 = 0;
  this_00[1].field_0x20 = 0;
  QSqlDriver::QSqlDriver((QSqlDriver *)this,(QSqlDriverPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_00118168;
  *(undefined8 *)(*(long *)(this + 8) + 0xa8) = 0;
  qMySqlConnectionCount = qMySqlConnectionCount + 1;
  qLibraryInit();
  return;
}

Assistant:

QMYSQLDriver::QMYSQLDriver(QObject * parent)
    : QSqlDriver(*new QMYSQLDriverPrivate, parent)
{
    init();
    qLibraryInit();
}